

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIso.c
# Opt level: O2

Aig_Man_t * Saig_ManIsoReduce(Aig_Man_t *pAig,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  Vec_Vec_t *p;
  uint uVar1;
  int iVar2;
  abctime aVar3;
  Aig_Man_t *pAVar4;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  abctime time;
  int i_00;
  int i;
  uint i_01;
  
  aVar3 = Abc_Clock();
  pAVar4 = Iso_ManFilterPos(pAig,pvPosEquivs,fVerbose);
  printf("Reduced %d outputs to %d outputs.  ",(ulong)(uint)pAig->nTruePos,
         (ulong)(uint)pAVar4->nTruePos);
  aVar5 = Abc_Clock();
  Abc_PrintTime(0x77b9b0,(char *)(aVar5 - aVar3),time);
  if (((fVerbose != 0) && (*pvPosEquivs != (Vec_Ptr_t *)0x0)) &&
     (pAig->nTruePos != (*pvPosEquivs)->nSize)) {
    puts("Nontrivial classes:");
    p = (Vec_Vec_t *)*pvPosEquivs;
    for (i_01 = 0; (int)i_01 < p->nSize; i_01 = i_01 + 1) {
      i_00 = 0;
      while( true ) {
        pVVar6 = Vec_VecEntryInt(p,i_01);
        if (pVVar6->nSize <= i_00) break;
        pVVar6 = Vec_VecEntryInt(p,i_01);
        uVar1 = Vec_IntEntry(pVVar6,i_00);
        iVar2 = Vec_VecLevelSize(p,i_01);
        if (iVar2 == 1) break;
        if (i_00 == 0) {
          printf(" %4d : {",(ulong)i_01);
        }
        printf(" %d",(ulong)uVar1);
        iVar2 = Vec_VecLevelSize(p,i_01);
        if (i_00 == iVar2 + -1) {
          puts(" }");
        }
        i_00 = i_00 + 1;
      }
    }
  }
  return pAVar4;
}

Assistant:

Aig_Man_t * Saig_ManIsoReduce( Aig_Man_t * pAig, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{ 
    Aig_Man_t * pPart;
    abctime clk = Abc_Clock();
    pPart = Iso_ManFilterPos( pAig, pvPosEquivs, fVerbose );
    printf( "Reduced %d outputs to %d outputs.  ", Saig_ManPoNum(pAig), Saig_ManPoNum(pPart) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    if ( fVerbose && *pvPosEquivs && Saig_ManPoNum(pAig) != Vec_PtrSize(*pvPosEquivs) )
    {
        printf( "Nontrivial classes:\n" );
        Vec_VecPrintInt( (Vec_Vec_t *)*pvPosEquivs, 1 );
    }
//    Aig_ManStopP( &pPart );
    return pPart;
}